

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::EnableTracingRequest::EnableTracingRequest(EnableTracingRequest *this)

{
  EnableTracingRequest *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__EnableTracingRequest_009c30c0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig>::CopyablePtr(&this->trace_config_);
  this->attach_notification_only_ = false;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<3UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

EnableTracingRequest::EnableTracingRequest() = default;